

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Array<capnp::word>_>::truncate
          (ArrayBuilder<kj::Array<capnp::word>_> *this,char *__file,__off_t __length)

{
  Array<capnp::word> *pAVar1;
  Array<capnp::word> *pAVar2;
  word *pwVar3;
  size_t sVar4;
  
  pAVar1 = this->ptr;
  pAVar2 = this->pos;
  while (pAVar1 + (long)__file < pAVar2) {
    this->pos = pAVar2 + -1;
    pwVar3 = pAVar2[-1].ptr;
    if (pwVar3 != (word *)0x0) {
      sVar4 = pAVar2[-1].size_;
      pAVar2[-1].ptr = (word *)0x0;
      pAVar2[-1].size_ = 0;
      (*(code *)**(undefined8 **)pAVar2[-1].disposer)(pAVar2[-1].disposer,pwVar3,8,sVar4,sVar4,0);
    }
    pAVar2 = this->pos;
  }
  return (int)pAVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }